

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O1

ssize_t tnt_io_sendv(tnt_stream_net *s,iovec *iov,int count)

{
  size_t *psVar1;
  char *buf;
  ulong uVar2;
  size_t size;
  ssize_t sVar3;
  long lVar4;
  ulong uVar5;
  
  buf = (s->sbuf).buf;
  if (buf == (char *)0x0) {
    sVar3 = tnt_io_sendv_raw(s,iov,count,1);
    return sVar3;
  }
  if (count < 1) {
    uVar5 = 0;
  }
  else {
    lVar4 = 0;
    uVar5 = 0;
    do {
      uVar5 = uVar5 + *(long *)((long)&iov->iov_len + lVar4);
      lVar4 = lVar4 + 0x10;
    } while ((ulong)(uint)count << 4 != lVar4);
  }
  uVar2 = (s->sbuf).size;
  if (uVar2 < uVar5) {
    s->error = TNT_EBIG;
  }
  else {
    size = (s->sbuf).off;
    if (size + uVar5 <= uVar2) {
      if (count < 1) {
        return uVar5;
      }
      lVar4 = 0;
      do {
        memcpy((s->sbuf).buf + (s->sbuf).off,*(void **)((long)&iov->iov_base + lVar4),
               *(size_t *)((long)&iov->iov_len + lVar4));
        psVar1 = &(s->sbuf).off;
        *psVar1 = *psVar1 + *(long *)((long)&iov->iov_len + lVar4);
        lVar4 = lVar4 + 0x10;
      } while ((ulong)(uint)count << 4 != lVar4);
      return uVar5;
    }
    sVar3 = tnt_io_send_raw(s,buf,size,1);
    if (sVar3 != -1) {
      (s->sbuf).off = 0;
      if (count < 1) {
        return uVar5;
      }
      lVar4 = 0;
      do {
        memcpy((s->sbuf).buf + (s->sbuf).off,*(void **)((long)&iov->iov_base + lVar4),
               *(size_t *)((long)&iov->iov_len + lVar4));
        psVar1 = &(s->sbuf).off;
        *psVar1 = *psVar1 + *(long *)((long)&iov->iov_len + lVar4);
        lVar4 = lVar4 + 0x10;
      } while ((ulong)(uint)count << 4 != lVar4);
      return uVar5;
    }
  }
  return -1;
}

Assistant:

ssize_t
tnt_io_sendv(struct tnt_stream_net *s, struct iovec *iov, int count)
{
	if (s->sbuf.buf == NULL)
		return tnt_io_sendv_raw(s, iov, count, 1);
	size_t size = 0;
	int i;
	for (i = 0 ; i < count ; i++)
		size += iov[i].iov_len;
	if (size > s->sbuf.size) {
		s->error = TNT_EBIG;
		return -1;
	}
	if ((s->sbuf.off + size) <= s->sbuf.size) {
		tnt_io_sendv_put(s, iov, count);
		return size;
	}
	ssize_t r = tnt_io_send_raw(s, s->sbuf.buf, s->sbuf.off, 1);
	if (r == -1)
		return -1;
	s->sbuf.off = 0;
	tnt_io_sendv_put(s, iov, count);
	return size;
}